

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O0

int UpnpSetWebServerCorsString(char *corsString)

{
  int iVar1;
  size_t sVar2;
  char *corsString_local;
  
  if (UpnpSdkInit == 0) {
    corsString_local._4_4_ = -0x74;
  }
  else {
    if ((corsString != (char *)0x0) && (sVar2 = strlen(corsString), sVar2 != 0)) {
      membuffer_destroy(&gWebserverCorsString);
      iVar1 = web_server_set_cors(corsString);
      return iVar1;
    }
    corsString_local._4_4_ = -0x65;
  }
  return corsString_local._4_4_;
}

Assistant:

int UpnpSetWebServerCorsString(const char *corsString)
{
	if (UpnpSdkInit == 0)
		return UPNP_E_FINISH;
	if ((corsString == NULL) || (strlen(corsString) == 0)) {
		return UPNP_E_INVALID_PARAM;
	}

	membuffer_destroy(&gWebserverCorsString);

	return web_server_set_cors(corsString);
}